

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void __thiscall
duckdb::ReservoirQuantileState<int>::FillReservoir
          (ReservoirQuantileState<int> *this,idx_t sample_size,int element)

{
  ulong uVar1;
  BaseReservoirSampling *pBVar2;
  
  uVar1 = this->pos;
  if (uVar1 < sample_size) {
    this->pos = uVar1 + 1;
    this->v[uVar1] = element;
    duckdb::BaseReservoirSampling::InitializeReservoirWeights((ulong)this->r_samp,uVar1 + 1);
    return;
  }
  pBVar2 = this->r_samp;
  if (*(long *)(pBVar2 + 0x30) == *(long *)(pBVar2 + 0x48)) {
    this->v[*(long *)(pBVar2 + 0x40)] = element;
    duckdb::BaseReservoirSampling::ReplaceElement(-1.0);
    return;
  }
  return;
}

Assistant:

void FillReservoir(idx_t sample_size, T element) {
		if (pos < sample_size) {
			v[pos++] = element;
			r_samp->InitializeReservoirWeights(pos, len);
		} else {
			D_ASSERT(r_samp->next_index_to_sample >= r_samp->num_entries_to_skip_b4_next_sample);
			if (r_samp->next_index_to_sample == r_samp->num_entries_to_skip_b4_next_sample) {
				ReplaceElement(element);
			}
		}
	}